

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_dr_wav_get_cursor_in_pcm_frames(ma_dr_wav *pWav,ma_uint64 *pCursor)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pCursor != (ma_uint64 *)0x0) && (*pCursor = 0, pWav != (ma_dr_wav *)0x0)) {
    *pCursor = pWav->readCursorInPCMFrames;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_dr_wav_get_cursor_in_pcm_frames(ma_dr_wav* pWav, ma_uint64* pCursor)
{
    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }
    *pCursor = 0;
    if (pWav == NULL) {
        return MA_INVALID_ARGS;
    }
    *pCursor = pWav->readCursorInPCMFrames;
    return MA_SUCCESS;
}